

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::UpsampleLayerParams::Clear(UpsampleLayerParams *this)

{
  (this->scalingfactor_).current_size_ = 0;
  (this->fractionalscalingfactor_).current_size_ = 0;
  this->mode_ = 0;
  this->linearupsamplemode_ = 0;
  return;
}

Assistant:

void UpsampleLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UpsampleLayerParams)
  scalingfactor_.Clear();
  fractionalscalingfactor_.Clear();
  ::memset(&mode_, 0, reinterpret_cast<char*>(&linearupsamplemode_) -
    reinterpret_cast<char*>(&mode_) + sizeof(linearupsamplemode_));
}